

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall zmq::object_t::send_own(object_t *this,own_t *destination_,own_t *object_)

{
  command_t cmd;
  command_t local_c0 [2];
  
  own_t::inc_seqnum(destination_);
  local_c0[0].type = own;
  local_c0[0].destination = &destination_->super_object_t;
  local_c0[0].args._0_8_ = object_;
  ctx_t::send_command(this->_ctx,(destination_->super_object_t)._tid,local_c0);
  return;
}

Assistant:

void zmq::object_t::send_own (own_t *destination_, own_t *object_)
{
    destination_->inc_seqnum ();
    command_t cmd;
    cmd.destination = destination_;
    cmd.type = command_t::own;
    cmd.args.own.object = object_;
    send_command (cmd);
}